

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallCxxModuleBmiGenerator::~cmInstallCxxModuleBmiGenerator
          (cmInstallCxxModuleBmiGenerator *this)

{
  cmInstallCxxModuleBmiGenerator *this_local;
  
  ~cmInstallCxxModuleBmiGenerator(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

cmInstallCxxModuleBmiGenerator::~cmInstallCxxModuleBmiGenerator() = default;